

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_decimal.hpp
# Opt level: O0

unsigned_short
duckdb::TryCastDecimalCInternal<unsigned_short>(duckdb_result *source,idx_t col,idx_t row)

{
  bool bVar1;
  unsigned_short result_value;
  idx_t in_stack_00000070;
  idx_t in_stack_00000078;
  unsigned_short *in_stack_00000080;
  duckdb_result *in_stack_00000088;
  undefined2 local_22;
  undefined2 local_2;
  
  bVar1 = CastDecimalCInternal<unsigned_short>
                    (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000070);
  if (bVar1) {
    local_2 = local_22;
  }
  else {
    local_2 = FetchDefaultValue::Operation<unsigned_short>();
  }
  return local_2;
}

Assistant:

RESULT_TYPE TryCastDecimalCInternal(duckdb_result *source, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!CastDecimalCInternal<RESULT_TYPE>(source, result_value, col, row)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}